

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioCfgInterfaces(uint ifFlags)

{
  FILE *pFVar1;
  int iVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: ifFlags=%X\n",myTimeStamp::buf,"gpioCfgInterfaces",ifFlags);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\x01') {
    iVar2 = -0x20;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio initialised, call gpioTerminate()\n",myTimeStamp::buf,
              "gpioCfgInterfaces");
    }
  }
  else if (ifFlags < 0x10) {
    iVar2 = 0;
    gpioCfg.ifFlags = ifFlags;
  }
  else {
    iVar2 = -0x1a;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: bad ifFlags (%X)\n",myTimeStamp::buf,"gpioCfgInterfaces",ifFlags);
    }
  }
  return iVar2;
}

Assistant:

int gpioCfgInterfaces(unsigned ifFlags)
{
   DBG(DBG_USER, "ifFlags=%X", ifFlags);

   CHECK_NOT_INITED;

   if (ifFlags > 15)
      SOFT_ERROR(PI_BAD_IF_FLAGS, "bad ifFlags (%X)", ifFlags);

   gpioCfg.ifFlags = ifFlags;

   return 0;
}